

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O3

string * duckdb_parameter_name_internal_abi_cxx11_
                   (string *__return_storage_ptr__,duckdb_prepared_statement prepared_statement,
                   idx_t index)

{
  bool bVar1;
  pointer pPVar2;
  __node_base *p_Var3;
  string *extraout_RAX;
  duckdb_prepared_statement this;
  
  if ((prepared_statement != (duckdb_prepared_statement)0x0) &&
     (*(long *)(prepared_statement + 0x38) != 0)) {
    this = prepared_statement + 0x38;
    pPVar2 = duckdb::
             unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
             ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                           *)this);
    bVar1 = duckdb::PreparedStatement::HasError(pPVar2);
    if (!bVar1) {
      pPVar2 = duckdb::
               unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
               ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                             *)this);
      if (index <= (pPVar2->named_param_map)._M_h._M_element_count) {
        pPVar2 = duckdb::
                 unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                 ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                               *)this);
        p_Var3 = &(pPVar2->named_param_map)._M_h._M_before_begin;
        while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
          if (p_Var3[5]._M_nxt == (_Hash_node_base *)index) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)__return_storage_ptr__,p_Var3[1]._M_nxt,
                       (long)&(p_Var3[1]._M_nxt)->_M_nxt +
                       (long)&(*(_Hash_node_base **)
                                &((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor)->_M_nxt
                      );
            return extraout_RAX;
          }
        }
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return (string *)&__return_storage_ptr__->field_2;
}

Assistant:

static duckdb::string duckdb_parameter_name_internal(duckdb_prepared_statement prepared_statement, idx_t index) {
	auto wrapper = (PreparedStatementWrapper *)prepared_statement;
	if (!wrapper || !wrapper->statement || wrapper->statement->HasError()) {
		return duckdb::string();
	}
	if (index > wrapper->statement->named_param_map.size()) {
		return duckdb::string();
	}
	for (auto &item : wrapper->statement->named_param_map) {
		auto &identifier = item.first;
		auto &param_idx = item.second;
		if (param_idx == index) {
			// Found the matching parameter
			return identifier;
		}
	}
	// No parameter was found with this index
	return duckdb::string();
}